

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

void __thiscall adios2::Engine::Close(Engine *this,int transportIndex)

{
  long *in_RDI;
  string name;
  Engine *in_stack_00000030;
  IO *io;
  string local_70 [32];
  string *local_50;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"in call to Engine::Close",&local_31);
  helper::CheckForNullptr<adios2::core::Engine>(in_stack_00000030,_name);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  adios2::core::Engine::Close((int)*in_RDI);
  local_50 = (string *)adios2::core::Engine::GetIO();
  std::__cxx11::string::string(local_70,(string *)(*in_RDI + 0x30));
  adios2::core::IO::RemoveEngine(local_50);
  *in_RDI = 0;
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void Engine::Close(const int transportIndex)
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::Close");
    m_Engine->Close(transportIndex);

    // erase Engine object from IO
    core::IO &io = m_Engine->GetIO();
    const std::string name = m_Engine->m_Name;
    io.RemoveEngine(name);
    m_Engine = nullptr;
}